

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O3

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  bool bVar1;
  bool bVar2;
  undefined8 *in_RDI;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  Matrix2f MVar6;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  uVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    MVar6.m_elements[2] = *(float *)((long)in_RDI + uVar3 * 4);
    MVar6.m_elements[0] = *(float *)((long)in_RDI + uVar3 * 4 + 8);
    lVar5 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      MVar6.m_elements[2] =
           MVar6.m_elements[2] + y->m_elements[lVar5] * x->m_elements[lVar5 * 2 + uVar3];
      MVar6.m_elements[0] =
           MVar6.m_elements[0] + x->m_elements[lVar5 * 2 + uVar3] * y->m_elements[lVar5 + 2];
      lVar5 = 1;
      bVar1 = false;
    } while (bVar4);
    *(float *)((long)in_RDI + uVar3 * 4) = MVar6.m_elements[2];
    *(float *)((long)in_RDI + (uVar3 | 2) * 4) = MVar6.m_elements[0];
    uVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  MVar6.m_elements[1] = 0.0;
  MVar6.m_elements[3] = 0.0;
  return (Matrix2f)MVar6.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}